

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O3

void __thiscall
cmParseJacocoCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  string *__k;
  _func_int **pp_Var1;
  char *pcVar2;
  pointer piVar3;
  cmCTest *pcVar4;
  long lVar5;
  char *pcVar6;
  pointer pcVar7;
  iterator iVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  mapped_type *pmVar12;
  ostream *poVar13;
  pointer pbVar14;
  long *plVar15;
  long *plVar16;
  _func_int **pp_Var17;
  long lVar18;
  ulong uVar19;
  char **ppcVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string line;
  ifstream fin;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  long *local_3d0 [2];
  long local_3c0 [2];
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  iVar10 = std::__cxx11::string::compare((char *)name);
  if (iVar10 == 0) {
    pcVar2 = atts[1];
    pcVar6 = (char *)(this->PackageName)._M_string_length;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)&this->PackageName,0,pcVar6,(ulong)pcVar2);
    pcVar7 = (this->Coverage->SourceDir)._M_dataplus._M_p;
    local_3d0[0] = local_3c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3d0,pcVar7,pcVar7 + (this->Coverage->SourceDir)._M_string_length);
    std::__cxx11::string::append((char *)local_3d0);
    plVar15 = (long *)std::__cxx11::string::_M_append
                                ((char *)local_3d0,(ulong)(this->ModuleName)._M_dataplus._M_p);
    plVar16 = plVar15 + 2;
    if ((long *)*plVar15 == plVar16) {
      local_3e0 = *plVar16;
      lStack_3d8 = plVar15[3];
      local_3f0 = &local_3e0;
    }
    else {
      local_3e0 = *plVar16;
      local_3f0 = (long *)*plVar15;
    }
    local_3e8 = plVar15[1];
    *plVar15 = (long)plVar16;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_3f0);
    pp_Var1 = (_func_int **)(local_3b0 + 0x10);
    pp_Var17 = (_func_int **)(plVar15 + 2);
    if ((_func_int **)*plVar15 == pp_Var17) {
      local_3a0[0]._0_8_ = *pp_Var17;
      local_3a0[0]._8_8_ = plVar15[3];
      local_3b0._0_8_ = pp_Var1;
    }
    else {
      local_3a0[0]._0_8_ = *pp_Var17;
      local_3b0._0_8_ = (_func_int **)*plVar15;
    }
    local_3b0._8_8_ = plVar15[1];
    *plVar15 = (long)pp_Var17;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::_M_append
                                (local_3b0,(ulong)(this->PackageName)._M_dataplus._M_p);
    pp_Var17 = (_func_int **)(plVar15 + 2);
    if ((_func_int **)*plVar15 == pp_Var17) {
      local_228._M_allocated_capacity = (size_type)*pp_Var17;
      local_228._8_8_ = plVar15[3];
      local_238._0_8_ = local_238 + 0x10;
    }
    else {
      local_228._M_allocated_capacity = (size_type)*pp_Var17;
      local_238._0_8_ = (_func_int **)*plVar15;
    }
    local_238._8_8_ = plVar15[1];
    *plVar15 = (long)pp_Var17;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    if ((_func_int **)local_3b0._0_8_ != pp_Var1) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0,local_3e0 + 1);
    }
    if (local_3d0[0] != local_3c0) {
      operator_delete(local_3d0[0],local_3c0[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->FilePaths,(value_type *)local_238);
    pcVar7 = (this->Coverage->SourceDir)._M_dataplus._M_p;
    local_3f0 = &local_3e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3f0,pcVar7,pcVar7 + (this->Coverage->SourceDir)._M_string_length);
    std::__cxx11::string::append((char *)&local_3f0);
    plVar15 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_3f0,(ulong)(this->PackageName)._M_dataplus._M_p);
    pp_Var17 = (_func_int **)(plVar15 + 2);
    if ((_func_int **)*plVar15 == pp_Var17) {
      local_3a0[0]._0_8_ = *pp_Var17;
      local_3a0[0]._8_8_ = plVar15[3];
      local_3b0._0_8_ = pp_Var1;
    }
    else {
      local_3a0[0]._0_8_ = *pp_Var17;
      local_3b0._0_8_ = (_func_int **)*plVar15;
    }
    local_3b0._8_8_ = plVar15[1];
    *plVar15 = (long)pp_Var17;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_238,(string *)local_3b0);
    if ((_func_int **)local_3b0._0_8_ != pp_Var1) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0,local_3e0 + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->FilePaths,(value_type *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_allocated_capacity + 1));
    }
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)name);
    if (iVar10 == 0) {
      pcVar2 = atts[1];
      pcVar6 = (char *)(this->FileName)._M_string_length;
      strlen(pcVar2);
      std::__cxx11::string::_M_replace((ulong)&this->FileName,0,pcVar6,(ulong)pcVar2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Reading file: ",0xe);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_238,(this->FileName)._M_dataplus._M_p,
                           (this->FileName)._M_string_length);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                   ,0x36,(char *)local_3b0._0_8_,this->Coverage->Quiet);
      if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      std::ios_base::~ios_base(local_1c8);
      pbVar14 = (this->FilePaths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->FilePaths).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar14) {
        lVar18 = 8;
        pp_Var1 = (_func_int **)(local_238 + 0x10);
        uVar19 = 0;
        do {
          local_3b0._0_8_ = local_3b0 + 0x10;
          lVar5 = *(long *)((long)pbVar14 + lVar18 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3b0,lVar5,
                     *(long *)((long)&(pbVar14->_M_dataplus)._M_p + lVar18) + lVar5);
          std::__cxx11::string::append((char *)local_3b0);
          plVar15 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_3b0,(ulong)(this->FileName)._M_dataplus._M_p);
          pp_Var17 = (_func_int **)(plVar15 + 2);
          if ((_func_int **)*plVar15 == pp_Var17) {
            local_228._M_allocated_capacity = (size_type)*pp_Var17;
            local_228._8_8_ = plVar15[3];
            local_238._0_8_ = pp_Var1;
          }
          else {
            local_228._M_allocated_capacity = (size_type)*pp_Var17;
            local_238._0_8_ = (_func_int **)*plVar15;
          }
          local_238._8_8_ = plVar15[1];
          *plVar15 = (long)pp_Var17;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
            operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1))
            ;
          }
          bVar9 = cmsys::SystemTools::FileExists((char *)local_238._0_8_);
          if (bVar9) {
            std::__cxx11::string::_M_assign((string *)&this->CurFileName);
            if ((_func_int **)local_238._0_8_ != pp_Var1) {
              operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_allocated_capacity + 1));
            }
            break;
          }
          if ((_func_int **)local_238._0_8_ != pp_Var1) {
            operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_allocated_capacity + 1));
          }
          uVar19 = uVar19 + 1;
          pbVar14 = (this->FilePaths).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar18 = lVar18 + 0x20;
        } while (uVar19 < (ulong)((long)(this->FilePaths).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14
                                 >> 5));
      }
      __k = &this->CurFileName;
      std::ifstream::ifstream(local_238,(this->CurFileName)._M_dataplus._M_p,_S_in);
      iVar10 = std::__cxx11::string::compare((char *)__k);
      pp_Var1 = (_func_int **)(local_3b0 + 0x10);
      if ((iVar10 == 0) || ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) != 0))
      {
        pcVar7 = (this->Coverage->BinaryDir)._M_dataplus._M_p;
        local_3f0 = &local_3e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f0,pcVar7,pcVar7 + (this->Coverage->BinaryDir)._M_string_length
                  );
        std::__cxx11::string::append((char *)&local_3f0);
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_3f0,(ulong)(this->FileName)._M_dataplus._M_p);
        pp_Var17 = (_func_int **)(plVar15 + 2);
        if ((_func_int **)*plVar15 == pp_Var17) {
          local_3a0[0]._0_8_ = *pp_Var17;
          local_3a0[0]._8_8_ = plVar15[3];
          local_3b0._0_8_ = pp_Var1;
        }
        else {
          local_3a0[0]._0_8_ = *pp_Var17;
          local_3b0._0_8_ = (_func_int **)*plVar15;
        }
        local_3b0._8_8_ = plVar15[1];
        *plVar15 = (long)pp_Var17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::operator=((string *)__k,(string *)local_3b0);
        if ((_func_int **)local_3b0._0_8_ != pp_Var1) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
        }
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0,local_3e0 + 1);
        }
        std::ifstream::open(local_238,(_Ios_Openmode)(__k->_M_dataplus)._M_p);
        if ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"Jacoco Coverage: Error opening ",0x1f);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b0,(this->CurFileName)._M_dataplus._M_p,
                               (this->CurFileName)._M_string_length);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          pcVar4 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                       ,0x4a,(char *)local_3f0,false);
          if (local_3f0 != &local_3e0) {
            operator_delete(local_3f0,local_3e0 + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base(local_340);
          this->Coverage->Error = this->Coverage->Error + 1;
        }
      }
      local_3b0._8_8_ = 0;
      local_3a0[0]._M_allocated_capacity = local_3a0[0]._M_allocated_capacity & 0xffffffffffffff00;
      local_3b0._0_8_ = pp_Var1;
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->Coverage->TotalCoverage,__k);
      if ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) == 0) {
        local_3f0 = (long *)CONCAT44(local_3f0._4_4_,0xffffffff);
        iVar8._M_current =
             (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (pmVar12,iVar8,(int *)&local_3f0);
        }
        else {
          *iVar8._M_current = -1;
          (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar8._M_current + 1;
        }
      }
      while (bVar9 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)local_238,(string *)local_3b0,(bool *)0x0,-1), bVar9) {
        local_3f0 = (long *)CONCAT44(local_3f0._4_4_,0xffffffff);
        iVar8._M_current =
             (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (pmVar12,iVar8,(int *)&local_3f0);
        }
        else {
          *iVar8._M_current = -1;
          (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar8._M_current + 1;
        }
      }
      if ((_func_int **)local_3b0._0_8_ != pp_Var1) {
        operator_delete((void *)local_3b0._0_8_,local_3a0[0]._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(local_238);
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)name);
      if (iVar10 == 0) {
        pcVar2 = atts[1];
        pcVar6 = (char *)(this->ModuleName)._M_string_length;
        strlen(pcVar2);
        std::__cxx11::string::_M_replace((ulong)&this->ModuleName,0,pcVar6,(ulong)pcVar2);
        return;
      }
      iVar10 = std::__cxx11::string::compare((char *)name);
      if (iVar10 == 0) {
        ppcVar20 = atts + 1;
        uVar11 = 0xffffffff;
        iVar10 = -1;
        do {
          pcVar2 = ppcVar20[-1];
          if (*pcVar2 == 'n') {
            if ((pcVar2[1] == 'r') && (pcVar2[2] == '\0')) {
              uVar11 = atoi(*ppcVar20);
            }
          }
          else if (((*pcVar2 == 'c') && (pcVar2[1] == 'i')) && (pcVar2[2] == '\0')) {
            iVar10 = atoi(*ppcVar20);
          }
          ppcVar20 = ppcVar20 + 1;
        } while ((int)uVar11 < 1 || iVar10 < 0);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
        piVar3 = (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar3 != (pmVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          piVar3[(ulong)uVar11 - 1] = iVar10;
        }
      }
    }
  }
  return;
}

Assistant:

virtual void StartElement(const std::string& name,
      const char** atts)
      {
      if(name == "package")
        {
        this->PackageName = atts[1];
        std::string FilePath = this->Coverage.SourceDir +
          "/" + this->ModuleName + "/src/main/java/" +
          this->PackageName;
        this->FilePaths.push_back(FilePath);
        FilePath = this->Coverage.SourceDir +
         "/src/main/java/" + this->PackageName;
        this->FilePaths.push_back(FilePath);
        }
      else if(name == "sourcefile")
        {
        this->FileName = atts[1];
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
          "Reading file: " << this->FileName << std::endl,
          this->Coverage.Quiet);
          for(size_t i=0;i < FilePaths.size();i++)
            {
            std::string finalpath = FilePaths[i] + "/" + this->FileName;
            if(cmSystemTools::FileExists(finalpath.c_str()))
              {
              this->CurFileName = finalpath;
              break;
              }
            }
          cmsys::ifstream fin(this->CurFileName.c_str());
          if(this->CurFileName == "" || !fin )
          {
            this->CurFileName = this->Coverage.BinaryDir + "/" +
                                   this->FileName;
            fin.open(this->CurFileName.c_str());
            if (!fin)
            {
              cmCTestLog(this->CTest, ERROR_MESSAGE,
                         "Jacoco Coverage: Error opening " << this->CurFileName
                         << std::endl);
              this->Coverage.Error++;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          if(fin)
            {
            curFileLines.push_back(-1);
            }
          while(cmSystemTools::GetLineFromStream(fin, line))
          {
            curFileLines.push_back(-1);
          }
        }
      else if(name == "report")
        {
        this->ModuleName=atts[1];
        }
      else if(name == "line")
        {
        int tagCount = 0;
        int nr = -1;
        int ci = -1;
        while(true)
          {
          if(strcmp(atts[tagCount],"ci") == 0)
            {
            ci = atoi(atts[tagCount+1]);
            }
          else if (strcmp(atts[tagCount],"nr") == 0)
            {
            nr = atoi(atts[tagCount+1]);
            }
          if (ci > -1 && nr > 0)
            {
            FileLinesType& curFileLines=
              this->Coverage.TotalCoverage[this->CurFileName];
            if(!curFileLines.empty())
               {
               curFileLines[nr-1] = ci;
               }
            break;
            }
          ++tagCount;
          }
        }
      }